

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineTemplate.h
# Opt level: O0

void __thiscall
kiste::LineTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp>::text_segment
          (LineTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp> *this,string *line)

{
  string *line_local;
  LineTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp> *this_local;
  
  cpp::text(this->_serialize,"\"");
  cpp::
  escape<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            (this->_serialize,line);
  cpp::text(this->_serialize,"\"");
  return;
}

Assistant:

void text_segment(const std::string& line)
    {
    _serialize.text("\"");_serialize.escape(line);_serialize.text("\"");
    }